

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O0

void Waitone(IceTCommunicator self,IceTCommRequest *icet_request)

{
  MPI_Request local_20;
  MPI_Request mpi_request;
  IceTCommRequest *icet_request_local;
  IceTCommunicator self_local;
  
  if (*icet_request != (IceTCommRequest)0x0) {
    mpi_request = (MPI_Request)icet_request;
    icet_request_local = (IceTCommRequest *)self;
    local_20 = getMPIRequest(*icet_request);
    MPI_Wait(&local_20,0);
    setMPIRequest(*(IceTCommRequest *)mpi_request,local_20);
    destroy_request(*(IceTCommRequest *)mpi_request);
    *(undefined8 *)mpi_request = 0;
  }
  return;
}

Assistant:

static void Waitone(IceTCommunicator self, IceTCommRequest *icet_request)
{
    MPI_Request mpi_request;

    /* To remove warning */
    (void)self;

    if (*icet_request == ICET_COMM_REQUEST_NULL) return;

    mpi_request = getMPIRequest(*icet_request);
    MPI_Wait(&mpi_request, MPI_STATUS_IGNORE);
    setMPIRequest(*icet_request, mpi_request);

    destroy_request(*icet_request);
    *icet_request = ICET_COMM_REQUEST_NULL;
}